

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

int __thiscall
icu_63::RuleBasedNumberFormat::clone
          (RuleBasedNumberFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RuleBasedNumberFormat *this_00;
  
  this_00 = (RuleBasedNumberFormat *)UMemory::operator_new((UMemory *)0x2f0,(size_t)__fn);
  if (this_00 != (RuleBasedNumberFormat *)0x0) {
    RuleBasedNumberFormat(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Format*
RuleBasedNumberFormat::clone(void) const
{
    return new RuleBasedNumberFormat(*this);
}